

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool flatbuffers::anon_unknown_1::LoadFileRaw(char *name,bool binary,string *buf)

{
  bool bVar1;
  char cVar2;
  string asStack_3b8 [32];
  ifstream ifs;
  streambuf local_388 [16];
  byte abStack_378 [488];
  ostringstream oss;
  
  bVar1 = DirExists(name);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    std::ifstream::ifstream(&ifs,name,(uint)!binary * 4 + _S_bin);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      bVar1 = false;
    }
    else {
      if (binary) {
        std::istream::seekg((long)&ifs,_S_beg);
        std::istream::tellg();
        std::__cxx11::string::resize((ulong)buf);
        std::istream::seekg((long)&ifs,_S_beg);
        std::istream::read((char *)&ifs,(long)(buf->_M_dataplus)._M_p);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        std::ostream::operator<<((ostream *)&oss,local_388);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)buf,asStack_3b8);
        std::__cxx11::string::~string(asStack_3b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      }
      bVar1 = (abStack_378[*(long *)(_ifs + -0x18)] & 1) == 0;
    }
    std::ifstream::~ifstream(&ifs);
  }
  return bVar1;
}

Assistant:

static bool LoadFileRaw(const char *name, bool binary, std::string *buf) {
  if (DirExists(name)) return false;
  std::ifstream ifs(name, binary ? std::ifstream::binary : std::ifstream::in);
  if (!ifs.is_open()) return false;
  if (binary) {
    // The fastest way to read a file into a string.
    ifs.seekg(0, std::ios::end);
    auto size = ifs.tellg();
    (*buf).resize(static_cast<size_t>(size));
    ifs.seekg(0, std::ios::beg);
    ifs.read(&(*buf)[0], (*buf).size());
  } else {
    // This is slower, but works correctly on all platforms for text files.
    std::ostringstream oss;
    oss << ifs.rdbuf();
    *buf = oss.str();
  }
  return !ifs.bad();
}